

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O0

void __thiscall
de::
SharedPtr<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::InitialCalibration>
::SharedPtr(SharedPtr<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::InitialCalibration>
            *this,InitialCalibration *ptr)

{
  InitialCalibration *pIVar1;
  SharedPtrState<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::InitialCalibration,_de::DefaultDeleter<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::InitialCalibration>_>
  *pSVar2;
  DefaultDeleter<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::InitialCalibration>
  local_25 [13];
  InitialCalibration *local_18;
  InitialCalibration *ptr_local;
  SharedPtr<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::InitialCalibration>
  *this_local;
  
  this->m_ptr = (InitialCalibration *)0x0;
  this->m_state = (SharedPtrStateBase *)0x0;
  this->m_ptr = ptr;
  local_18 = ptr;
  ptr_local = (InitialCalibration *)this;
  pSVar2 = (SharedPtrState<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::InitialCalibration,_de::DefaultDeleter<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::InitialCalibration>_>
            *)operator_new(0x20);
  pIVar1 = local_18;
  DefaultDeleter<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::InitialCalibration>
  ::DefaultDeleter(local_25);
  SharedPtrState<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::InitialCalibration,_de::DefaultDeleter<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::InitialCalibration>_>
  ::SharedPtrState(pSVar2,pIVar1);
  this->m_state = (SharedPtrStateBase *)pSVar2;
  this->m_state->strongRefCount = 1;
  this->m_state->weakRefCount = 1;
  return;
}

Assistant:

inline SharedPtr<T>::SharedPtr (T* ptr)
	: m_ptr		(DE_NULL)
	, m_state	(DE_NULL)
{
	try
	{
		m_ptr	= ptr;
		m_state	= new SharedPtrState<T, DefaultDeleter<T> >(ptr, DefaultDeleter<T>());
		m_state->strongRefCount	= 1;
		m_state->weakRefCount	= 1;
	}
	catch (...)
	{
		// \note ptr is not released.
		delete m_state;
		throw;
	}
}